

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O1

void __thiscall tfs::TMatrix<double>::randomize(TMatrix<double> *this)

{
  unsigned_long uVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  DNN_NUMERIC DVar5;
  undefined1 auVar6 [16];
  double dVar7;
  
  if ((((this->m_data != (double *)0x0) && (this->m_data < this->m_end)) &&
      (uVar1 = this->m_count, uVar1 != 0)) && (this->m_length != 0)) {
    auVar6._8_4_ = (int)(uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = 0x45300000;
    dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    dVar4 = 1.0;
    if (1.0 <= dVar7) {
      dVar4 = dVar7;
    }
    dVar4 = 1.0 / dVar4;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    pdVar2 = this->m_end;
    for (pdVar3 = this->m_data; pdVar3 < pdVar2; pdVar3 = pdVar3 + 1) {
      DVar5 = randomGauss();
      *pdVar3 = DVar5 * dVar4;
    }
    return;
  }
  report_problem("Error",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                 ,"randomize",0x5e,"empty matrix");
  return;
}

Assistant:

inline bool isEmpty( void ) const { return m_data == 0 || m_data >= m_end || m_count < 1 || m_length < 1; }